

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O0

void __thiscall
pg::ZLKQSolver::attractVertices(ZLKQSolver *this,int pl,int v,bitset *Z,bitset *R,bitset *Y)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  _label_vertex _Var4;
  int local_168;
  bool local_163;
  bool local_162;
  _label_vertex local_138;
  Game *local_128;
  int local_120;
  _label_vertex local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [28];
  int to;
  int *curedge_1;
  undefined1 local_b0 [7];
  bool escapes;
  Game *local_a0;
  int local_98;
  _label_vertex local_90;
  Game *local_80;
  int local_78;
  _label_vertex local_70;
  undefined1 local_60 [28];
  int from;
  int *curedge;
  bitset *Y_local;
  bitset *R_local;
  bitset *Z_local;
  int v_local;
  int pl_local;
  ZLKQSolver *this_local;
  uintqueue *local_10;
  
  curedge = (int *)Y;
  Y_local = R;
  R_local = Z;
  Z_local._0_4_ = v;
  Z_local._4_4_ = pl;
  _v_local = this;
  register0x00000000 = (uint *)Solver::ins(&this->super_Solver,v);
  local_60._20_4_ = *register0x00000000;
  do {
    if (local_60._20_4_ == 0xffffffff) {
      return;
    }
    bitset::operator[]((bitset *)local_60,(size_t)R_local);
    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_60);
    if (bVar1) {
      iVar2 = Solver::owner(&this->super_Solver,local_60._20_4_);
      if ((iVar2 == Z_local._4_4_) && (this->str[(int)local_60._20_4_] == -1)) {
        if (2 < (this->super_Solver).trace) {
          poVar3 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;37msetting strategy of \x1b[36m");
          _Var4 = Solver::label_vertex(&this->super_Solver,local_60._20_4_);
          local_80 = _Var4.g;
          local_78 = _Var4.v;
          local_70.g = local_80;
          local_70.v = local_78;
          poVar3 = operator<<(poVar3,&local_70);
          poVar3 = std::operator<<(poVar3,"\x1b[m to \x1b[1;36m");
          _Var4 = Solver::label_vertex(&this->super_Solver,(int)Z_local);
          local_a0 = _Var4.g;
          local_98 = _Var4.v;
          local_90.g = local_a0;
          local_90.v = local_98;
          poVar3 = operator<<(poVar3,&local_90);
          poVar3 = std::operator<<(poVar3,"\x1b[m");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        this->str[(int)local_60._20_4_] = (int)Z_local;
      }
    }
    else {
      bitset::operator[]((bitset *)local_b0,(size_t)Y_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_b0);
      if (bVar1) {
        iVar2 = Solver::owner(&this->super_Solver,local_60._20_4_);
        if (iVar2 != Z_local._4_4_) {
          curedge_1._7_1_ = 0;
          register0x00000000 = Solver::outs(&this->super_Solver,local_60._20_4_);
          local_d8._20_4_ = *register0x00000000;
          while ((curedge_1._7_1_ & 1) == 0 && local_d8._20_4_ != -1) {
            bitset::operator[]((bitset *)local_d8,(size_t)R_local);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_d8);
            local_162 = false;
            if (!bVar1) {
              bitset::operator[]((bitset *)local_e8,(size_t)Y_local);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_e8);
              local_163 = true;
              if (!bVar1) {
                bitset::operator[]((bitset *)local_f8,(size_t)curedge);
                local_163 = bitset::reference::operator_cast_to_bool((reference *)local_f8);
              }
              local_162 = local_163;
            }
            if (local_162 != false) {
              curedge_1._7_1_ = 1;
            }
            local_d8._20_4_ = stack0xffffffffffffff40[1];
            unique0x10000519 = stack0xffffffffffffff40 + 1;
          }
          if ((curedge_1._7_1_ & 1) != 0) goto LAB_001ea593;
        }
        bitset::operator[]((bitset *)local_108,(size_t)R_local);
        bitset::reference::operator=((reference *)local_108,true);
        iVar2 = Solver::owner(&this->super_Solver,local_60._20_4_);
        if (iVar2 == Z_local._4_4_) {
          local_168 = (int)Z_local;
        }
        else {
          local_168 = -1;
        }
        this->str[(int)local_60._20_4_] = local_168;
        local_10 = &this->Q;
        this_local._4_4_ = local_60._20_4_;
        iVar2 = (this->Q).pointer;
        (this->Q).pointer = iVar2 + 1;
        local_10->queue[iVar2] = local_60._20_4_;
        if (2 < (this->super_Solver).trace) {
          poVar3 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m");
          _Var4 = Solver::label_vertex(&this->super_Solver,local_60._20_4_);
          local_128 = _Var4.g;
          local_120 = _Var4.v;
          local_118.g = local_128;
          local_118.v = local_120;
          poVar3 = operator<<(poVar3,&local_118);
          poVar3 = std::operator<<(poVar3,"\x1b[m by \x1b[1;36m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,Z_local._4_4_);
          std::operator<<(poVar3,"\x1b[m");
          iVar2 = Solver::owner(&this->super_Solver,local_60._20_4_);
          if (iVar2 == Z_local._4_4_) {
            poVar3 = std::operator<<((this->super_Solver).logger," (via ");
            _Var4 = Solver::label_vertex(&this->super_Solver,(int)Z_local);
            local_138.g = _Var4.g;
            local_138.v = _Var4.v;
            poVar3 = operator<<(poVar3,&local_138);
            poVar3 = std::operator<<(poVar3,")");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar3 = std::operator<<((this->super_Solver).logger," (forced)");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
LAB_001ea593:
    local_60._20_4_ = stack0xffffffffffffffb8[1];
    unique0x10000541 = stack0xffffffffffffffb8 + 1;
  } while( true );
}

Assistant:

void
ZLKQSolver::attractVertices(const int pl, const int v, bitset &Z, bitset &R, bitset &Y)
{
    auto curedge = ins(v);
    for (int from = *curedge; from != -1; from = *++curedge) {
        if (Z[from]) {
            // already in Z, set strategy if not yet set
            if (owner(from) == pl and str[from] == -1) {
#ifndef NDEBUG
                if (trace >= 3) {
                    logger << "\033[1;37msetting strategy of \033[36m" << label_vertex(from) << "\033[m to \033[1;36m" << label_vertex(v) << "\033[m" << std::endl;
                }
#endif
                str[from] = v;
            }
        } else if (R[from]) {
            // a vertex in <R> that is not yet in <Z>
            if (owner(from) != pl) {
                // check each exit
                bool escapes = false;
                auto curedge = outs(from);
                for (int to = *curedge; !escapes and to != -1; to = *++curedge) {
                    // check if escapes to a vertex in <R> or <Y> that is not in <Z>
                    if (!Z[to] and (R[to] or Y[to])) escapes = true;
                }
                if (escapes) continue;
            }
            // vertex does not escape, so attract it
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}